

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::EndChild(void)

{
  ImGuiItemStatusFlags *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImVec2 sz;
  ImRect bb;
  ImRect local_28;
  
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  GImGui->WithinEndChild = true;
  if (pIVar2->BeginCount < 2) {
    sz = pIVar2->Size;
    fVar4 = sz.x;
    fVar5 = sz.y;
    if ((pIVar2->AutoFitChildAxises & 1U) != 0) {
      fVar6 = 4.0;
      if (4.0 <= fVar4) {
        fVar6 = fVar4;
      }
      fVar4 = fVar6;
      sz.y = fVar5;
      sz.x = fVar4;
    }
    fVar6 = fVar5;
    if ((pIVar2->AutoFitChildAxises & 2U) != 0) {
      fVar6 = 4.0;
      if (4.0 <= fVar5) {
        fVar6 = fVar5;
      }
      sz.y = fVar6;
    }
    End();
    bb.Min = (pIVar3->CurrentWindow->DC).CursorPos;
    bb.Max.y = fVar6 + bb.Min.y;
    bb.Max.x = fVar4 + bb.Min.x;
    ItemSize(&sz,-1.0);
    if ((((pIVar2->DC).NavLayersActiveMask == 0) && ((pIVar2->DC).NavHasScroll != true)) ||
       ((pIVar2->Flags & 0x800000) != 0)) {
      ItemAdd(&bb,0,(ImRect *)0x0,0);
    }
    else {
      ItemAdd(&bb,pIVar2->ChildId,(ImRect *)0x0,0);
      RenderNavHighlight(&bb,pIVar2->ChildId,1);
      if (((pIVar2->DC).NavLayersActiveMask == 0) && (pIVar2 == pIVar3->NavWindow)) {
        local_28.Min.x = bb.Min.x + -2.0;
        local_28.Min.y = bb.Min.y + -2.0;
        local_28.Max.x = bb.Max.x + 2.0;
        local_28.Max.y = bb.Max.y + 2.0;
        RenderNavHighlight(&local_28,pIVar3->NavId,2);
      }
    }
    if (pIVar3->HoveredWindow == pIVar2) {
      pIVar1 = &(pIVar3->LastItemData).StatusFlags;
      *(byte *)pIVar1 = (byte)*pIVar1 | 0x80;
    }
  }
  else {
    End();
  }
  pIVar3->WithinEndChild = false;
  pIVar3->LogLinePosY = -3.4028235e+38;
  return;
}

Assistant:

void ImGui::EndChild()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    IM_ASSERT(g.WithinEndChild == false);
    IM_ASSERT(window->Flags & ImGuiWindowFlags_ChildWindow);   // Mismatched BeginChild()/EndChild() calls

    g.WithinEndChild = true;
    if (window->BeginCount > 1)
    {
        End();
    }
    else
    {
        ImVec2 sz = window->Size;
        if (window->AutoFitChildAxises & (1 << ImGuiAxis_X)) // Arbitrary minimum zero-ish child size of 4.0f causes less trouble than a 0.0f
            sz.x = ImMax(4.0f, sz.x);
        if (window->AutoFitChildAxises & (1 << ImGuiAxis_Y))
            sz.y = ImMax(4.0f, sz.y);
        End();

        ImGuiWindow* parent_window = g.CurrentWindow;
        ImRect bb(parent_window->DC.CursorPos, parent_window->DC.CursorPos + sz);
        ItemSize(sz);
        if ((window->DC.NavLayersActiveMask != 0 || window->DC.NavHasScroll) && !(window->Flags & ImGuiWindowFlags_NavFlattened))
        {
            ItemAdd(bb, window->ChildId);
            RenderNavHighlight(bb, window->ChildId);

            // When browsing a window that has no activable items (scroll only) we keep a highlight on the child (pass g.NavId to trick into always displaying)
            if (window->DC.NavLayersActiveMask == 0 && window == g.NavWindow)
                RenderNavHighlight(ImRect(bb.Min - ImVec2(2, 2), bb.Max + ImVec2(2, 2)), g.NavId, ImGuiNavHighlightFlags_TypeThin);
        }
        else
        {
            // Not navigable into
            ItemAdd(bb, 0);
        }
        if (g.HoveredWindow == window)
            g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredWindow;
    }
    g.WithinEndChild = false;
    g.LogLinePosY = -FLT_MAX; // To enforce a carriage return
}